

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_211cf1c::Parser::Parser
          (Parser *this,spv_const_context context,void *user_data,
          spv_parsed_header_fn_t parsed_header_fn,spv_parsed_instruction_fn_t parsed_instruction_fn)

{
  spv_parsed_instruction_fn_t parsed_instruction_fn_local;
  spv_parsed_header_fn_t parsed_header_fn_local;
  void *user_data_local;
  spv_const_context context_local;
  Parser *this_local;
  
  spvtools::AssemblyGrammar::AssemblyGrammar(&this->grammar_,context);
  this->consumer_ = &context->consumer;
  this->user_data_ = user_data;
  this->parsed_header_fn_ = parsed_header_fn;
  this->parsed_instruction_fn_ = parsed_instruction_fn;
  State::State(&this->_);
  return;
}

Assistant:

Parser(const spv_const_context context, void* user_data,
         spv_parsed_header_fn_t parsed_header_fn,
         spv_parsed_instruction_fn_t parsed_instruction_fn)
      : grammar_(context),
        consumer_(context->consumer),
        user_data_(user_data),
        parsed_header_fn_(parsed_header_fn),
        parsed_instruction_fn_(parsed_instruction_fn) {}